

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O3

duckdb_state
duckdb_column_has_default(duckdb_table_description table_description,idx_t index,bool *out)

{
  bool bVar1;
  duckdb_state dVar2;
  pointer pTVar3;
  reference this;
  duckdb_state dVar4;
  
  dVar2 = GetTableDescription((TableDescriptionWrapper *)table_description,index);
  dVar4 = DuckDBError;
  if (dVar2 == DuckDBSuccess) {
    if (out == (bool *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)(table_description + 8),0,*(char **)(table_description + 0x10),0x1e0e752);
    }
    else {
      pTVar3 = duckdb::
               unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
               ::operator->((unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
                             *)table_description);
      this = duckdb::vector<duckdb::ColumnDefinition,_true>::operator[](&pTVar3->columns,index);
      bVar1 = duckdb::ColumnDefinition::HasDefaultValue(this);
      *out = bVar1;
      dVar4 = DuckDBSuccess;
    }
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_column_has_default(duckdb_table_description table_description, idx_t index, bool *out) {
	auto wrapper = reinterpret_cast<TableDescriptionWrapper *>(table_description);
	if (GetTableDescription(wrapper, index) == DuckDBError) {
		return DuckDBError;
	}
	if (!out) {
		wrapper->error = "Please provide a valid (non-null) 'out' variable";
		return DuckDBError;
	}

	auto &table = wrapper->description;
	auto &column = table->columns[index];
	*out = column.HasDefaultValue();
	return DuckDBSuccess;
}